

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIntPair.h
# Opt level: O2

intptr_t llvm::
         PointerIntPairInfo<void_*,_1U,_llvm::PointerUnionUIntTraits<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*>,_llvm::PointerUnion<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
         ::updatePointer(intptr_t OrigValue,void *Ptr)

{
  intptr_t PtrWord;
  
  if (((ulong)Ptr & 3) == 0) {
    return (ulong)((uint)OrigValue & 3) | (ulong)Ptr;
  }
  __assert_fail("(PtrWord & ~PointerBitMask) == 0 && \"Pointer is not sufficiently aligned\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerIntPair.h"
                ,0xa3,
                "static intptr_t llvm::PointerIntPairInfo<void *, 1, llvm::PointerUnionUIntTraits<llvm::PointerUnion<std::vector<unsigned char> *, std::vector<unsigned short> *>, llvm::PointerUnion<std::vector<unsigned int> *, std::vector<unsigned long> *>>>::updatePointer(intptr_t, PointerT) [PointerT = void *, IntBits = 1, PtrTraits = llvm::PointerUnionUIntTraits<llvm::PointerUnion<std::vector<unsigned char> *, std::vector<unsigned short> *>, llvm::PointerUnion<std::vector<unsigned int> *, std::vector<unsigned long> *>>]"
               );
}

Assistant:

static intptr_t updatePointer(intptr_t OrigValue, PointerT Ptr) {
    intptr_t PtrWord =
        reinterpret_cast<intptr_t>(PtrTraits::getAsVoidPointer(Ptr));
    assert((PtrWord & ~PointerBitMask) == 0 &&
           "Pointer is not sufficiently aligned");
    // Preserve all low bits, just update the pointer.
    return PtrWord | (OrigValue & ~PointerBitMask);
  }